

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void dump_fnbody(LispPTR fnblockaddr)

{
  fnhead *fnobj;
  ushort uVar1;
  DLword *pDVar2;
  uint uVar3;
  ulong uVar4;
  DLword *pDVar5;
  int iVar6;
  ulong uVar7;
  DLbyte *addr;
  DLword *pDVar8;
  
  uVar7 = (ulong)fnblockaddr;
  if ((fnblockaddr & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar7);
  }
  pDVar2 = Lisp_world;
  fnobj = (fnhead *)(Lisp_world + uVar7);
  printf("***DUMP Func Obj << ");
  if (((ulong)fnobj & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",fnobj);
  }
  iVar6 = 0;
  printf("start at 0x%x lisp address(%p 68k)\n",(ulong)((long)fnobj - (long)Lisp_world) >> 1,fnobj);
  print(*(uint *)&fnobj->field_0x8 & 0xfffffff);
  putchar(10);
  printf("stkmin    : %d\n",(ulong)fnobj->stkmin);
  printf("na        : %d\n",(ulong)(uint)(int)fnobj->na);
  printf("pv        : %d\n",(ulong)(uint)(int)fnobj->pv);
  printf("startpc   : %d\n",(ulong)fnobj->startpc);
  printf("argtype   : %d\n",(ulong)(*(uint *)&fnobj->field_0x8 >> 0x1c & 3));
  printf("framename : %d\n",(ulong)(*(uint *)&fnobj->field_0x8 & 0xfffffff));
  printf("ntsize    : %d\n",(ulong)fnobj->ntsize);
  printf("nlocals   : %d\n",(ulong)(byte)fnobj->field_0xd);
  printf("fvaroffset: %d\n",(ulong)(byte)fnobj->field_0xc);
  uVar4 = (ulong)fnobj->startpc;
  if (0x14 < fnobj->startpc) {
    pDVar5 = pDVar2 + uVar7 + 10;
    uVar7 = 0x14;
    pDVar8 = pDVar5;
    do {
      uVar1 = *(ushort *)((ulong)pDVar8 ^ 2);
      if (((ulong)pDVar2 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar5);
      }
      printf(" 0x%x(%p 68k): 0%6o  0x%4x\n",(ulong)((long)pDVar8 - (long)Lisp_world) >> 1,pDVar5,
             (ulong)uVar1,(ulong)uVar1);
      uVar7 = uVar7 + 2;
      uVar4 = (ulong)fnobj->startpc;
      pDVar5 = pDVar5 + 1;
      pDVar8 = pDVar8 + 1;
    } while (uVar7 < uVar4);
  }
  addr = (DLbyte *)((long)&fnobj->na + uVar4);
  do {
    uVar3 = print_opcode((uint)fnobj->startpc + iVar6,addr,fnobj);
    if ((int)uVar3 < 1) {
      return;
    }
    addr = addr + uVar3;
    iVar6 = iVar6 + uVar3;
  } while (iVar6 < 2000);
  return;
}

Assistant:

void dump_fnbody(LispPTR fnblockaddr)
/* atom index */
{
  struct fnhead *fnobj;
  DLbyte *scratch;
  int i;

  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fnblockaddr);

  printf("***DUMP Func Obj << ");
  printf("start at 0x%x lisp address(%p 68k)\n", LAddrFromNative(fnobj), (void *)fnobj);

  print(fnobj->framename);
  putchar('\n');

  printf("stkmin    : %d\n", fnobj->stkmin);
  printf("na        : %d\n", fnobj->na);
  printf("pv        : %d\n", fnobj->pv);
  printf("startpc   : %d\n", fnobj->startpc);
  printf("argtype   : %d\n", fnobj->argtype);
  printf("framename : %d\n", fnobj->framename);
  printf("ntsize    : %d\n", fnobj->ntsize);
  printf("nlocals   : %d\n", fnobj->nlocals);
  printf("fvaroffset: %d\n", fnobj->fvaroffset);

  scratch = (DLbyte *)fnobj;
  for (i = 20; i < (fnobj->startpc); i += 2) {
    int word;
    word = (int)(0xffff & (GETWORD((DLword *)(scratch + i))));
    printf(" 0x%x(%p 68k): 0%6o  0x%4x\n", LAddrFromNative(scratch + i), (void *)(scratch + i), word, word);
  }

  scratch = (DLbyte *)fnobj + (fnobj->startpc);
  for (i = 0; i < 2000; i++) {
    int len = print_opcode(fnobj->startpc + i, scratch, fnobj);
    if (len < 1) return;
    scratch += len;
    i += (len - 1);
  }

}